

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::dasmAdda<(moira::Instr)119,(moira::Mode)5,(moira::Size)4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  char *pcVar1;
  byte *pbVar2;
  StrWriter *pSVar3;
  Ea<(moira::Mode)5,_(moira::Size)4> src;
  Ea<(moira::Mode)5,_(moira::Size)4> local_34;
  
  local_34.reg = op & 7;
  local_34.pc = *addr;
  local_34.ext1 = dasmRead<(moira::Size)2>(this,addr);
  pSVar3 = StrWriter::operator<<(str);
  pSVar3 = StrWriter::operator<<(pSVar3);
  StrWriter::operator<<(pSVar3,(Align)(this->tab).raw);
  pSVar3 = StrWriter::operator<<(pSVar3,&local_34);
  StrWriter::operator<<(pSVar3,", ");
  pcVar1 = pSVar3->ptr;
  pSVar3->ptr = pcVar1 + 1;
  *pcVar1 = 'A';
  pbVar2 = (byte *)pSVar3->ptr;
  pSVar3->ptr = (char *)(pbVar2 + 1);
  *pbVar2 = (byte)(op >> 9) & 7 | 0x30;
  return;
}

Assistant:

void
Moira::dasmAdda(StrWriter &str, u32 &addr, u16 op)
{
    auto src = Op <M,S> ( _____________xxx(op), addr );
    auto dst = An       ( ____xxx_________(op)       );

    str << Ins<I>{} << Sz<S>{} << tab << src << ", " << dst;
}